

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall
CVmRun::call_func_ptr_fr
          (CVmRun *this,vm_val_t *funcptr,uint argc,vm_rcdesc *recurse_ctx,uint caller_ofs)

{
  vm_datatype_t vVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  vm_val_t invoker;
  int local_30 [2];
  uint local_28;
  undefined4 uStack_24;
  
  vVar1 = funcptr->typ;
  if (vVar1 == VM_BIFPTR) {
    sp_ = sp_ + -5;
    call_bif(this,(uint)(funcptr->val).prop,(uint)(funcptr->val).bifptr.func_idx,argc);
    return entry_ptr_native_ + caller_ofs;
  }
  if (vVar1 == VM_FUNCPTR) {
    puVar4 = do_call(this,caller_ofs,
                     (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                               [(funcptr->val).obj >>
                                ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem
                              + (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & (funcptr->val).obj)),
                     argc,recurse_ctx);
    return puVar4;
  }
  if ((vVar1 == VM_OBJ) &&
     (uVar2 = (funcptr->val).obj & 0xfff,
     iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(funcptr->val).obj >> 0xc][uVar2].ptr_ +
                         0x70))(G_obj_table_X.pages_[(funcptr->val).obj >> 0xc] + uVar2,local_30),
     iVar3 != 0)) {
    if (local_30[0] == 4) {
      puVar4 = (uchar *)CONCAT44(uStack_24,local_28);
    }
    else {
      if (local_30[0] != 0xc) goto LAB_001e5f70;
      puVar4 = (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                         [local_28 >>
                          ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                        (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & local_28));
    }
    if (puVar4 != (uchar *)0x0) {
      puVar4 = do_call(this,caller_ofs,puVar4,argc,recurse_ctx);
      return puVar4;
    }
  }
LAB_001e5f70:
  err_throw(0x7dd);
}

Assistant:

const uchar *CVmRun::call_func_ptr_fr(VMG_ const vm_val_t *funcptr, uint argc,
                                      const vm_rcdesc *recurse_ctx,
                                      uint caller_ofs)
{
    vm_val_t invoker;
    CVmObject *io;
    
    /* check what we have */
    switch (funcptr->typ)
    {
    case VM_OBJ:
        /* it's an object - check to see if it's invokable */
        if ((io = vm_objp(vmg_ funcptr->val.obj))->get_invoker(vmg_ &invoker))
        {
            /* get the invocation address, according to the invoker type */
            const void *invoke_addr;
            switch (invoker.typ)
            {
            case VM_FUNCPTR:
                invoke_addr = G_code_pool->get_ptr(invoker.val.ofs);
                break;
                
            case VM_CODEPTR:
                invoke_addr = invoker.val.ptr;
                break;
                
            default:
                invoke_addr = 0;
                break;
            }
            
            /* if we got a valid address, invoke the code */
            if (invoke_addr != 0)
            {
                /* call the function and return the new program counter */
                return do_call(
                    vmg_ caller_ofs, (const uchar *)invoke_addr, argc,
                    recurse_ctx);
            }
        }
        
        /* it's not invokable - throw an error */
        err_throw(VMERR_FUNCPTR_VAL_REQD);
        AFTER_ERR_THROW(return 0;)
            
    case VM_FUNCPTR:
        /* call the function */
        return do_call(vmg_ caller_ofs,
                       (const uchar *)G_code_pool->get_ptr(funcptr->val.ofs),
                       argc, recurse_ctx);
        
    case VM_BIFPTR:
        /* 
         *   Built-in function.  First, discard the invocation frame the
         *   caller set up for a regular method/function call, as builtins
         *   don't use those.  Then, decode the SetIndex:FuncIndex value and
         *   call the function.  
         */
        discard(5);
        call_bif(vmg_ funcptr->val.bifptr.set_idx,
                 funcptr->val.bifptr.func_idx, argc);

        /* proceed from the caller's address */
        return entry_ptr_native_ + caller_ofs;
        
    default:
        /* invalid type */
        err_throw(VMERR_FUNCPTR_VAL_REQD);
        AFTER_ERR_THROW(return 0;)
    }
}